

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::BlockThread
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,DWORD dwTimeout,bool fAlertable,
          bool fIsSleep,ThreadWakeupReason *ptwrWakeupReason,DWORD *pdwSignaledObject)

{
  ThreadNativeWaitData *ptnwdNativeWaitData;
  uint *puVar1;
  int iVar2;
  uint uVar3;
  ThreadWakeupReason TVar4;
  PAL_ERROR PVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  DWORD local_44;
  uint *puStack_40;
  DWORD dwSigObjIdx;
  ThreadWakeupReason local_34;
  
  local_34 = WaitFailed;
  local_44 = 0;
  puStack_40 = (uint *)SHMPtrToPtr((pthrCurrent->synchronizationInfo).m_shridWaitAwakened);
  if (puStack_40 == (uint *)0x0) {
    fprintf(_stderr,"] %s %s:%d","BlockThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xba);
    fprintf(_stderr,
            "Expression: NULL != pdwWaitState, Description: Got NULL pdwWaitState from m_shridWaitAwakened=%p\n"
            ,(pthrCurrent->synchronizationInfo).m_shridWaitAwakened);
  }
  if (fIsSleep) {
    if (fAlertable) {
      AcquireLocalSynchLock(pthrCurrent);
      AcquireSharedSynchLock(pthrCurrent);
      iVar2 = (*(this->super_IPalSynchronizationManager)._vptr_IPalSynchronizationManager[3])();
      if ((char)iVar2 == '\0') goto LAB_0033a102;
      ReleaseSharedSynchLock(pthrCurrent);
      ReleaseLocalSynchLock(pthrCurrent);
      TVar4 = Alerted;
      PVar5 = 0;
LAB_0033a0fb:
      bVar7 = false;
      goto LAB_0033a32b;
    }
LAB_0033a102:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
    LOCK();
    uVar3 = *puStack_40;
    bVar7 = uVar3 == 0;
    if (bVar7) {
      *puStack_40 = fAlertable + 1;
      uVar3 = 0;
    }
    UNLOCK();
    if (bVar7) {
      if (fAlertable) {
        ReleaseSharedSynchLock(pthrCurrent);
        ReleaseLocalSynchLock(pthrCurrent);
      }
      goto LAB_0033a13b;
    }
    if (fAlertable) {
      ReleaseSharedSynchLock(pthrCurrent);
      ReleaseLocalSynchLock(pthrCurrent);
    }
    if (uVar3 != 3) {
      fprintf(_stderr,"] %s %s:%d","BlockThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0xfa);
      fprintf(_stderr,"Unexpected thread wait state %u\n",(ulong)uVar3);
      return 0x54f;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
  }
  else {
LAB_0033a13b:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
    ptnwdNativeWaitData = &(pthrCurrent->synchronizationInfo).m_tnwdNativeData;
    PVar5 = ThreadNativeWait(ptnwdNativeWaitData,dwTimeout,&local_34,&local_44);
    if (PVar5 != 0) {
      if (PAL_InitializeChakraCoreCalled != false) {
        return PVar5;
      }
      goto LAB_0033a3d5;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
    bVar7 = false;
    PVar5 = 0;
    if (local_34 == WaitTimeout) {
      uVar6 = fAlertable + 1;
      LOCK();
      uVar3 = *puStack_40;
      bVar8 = uVar6 == uVar3;
      if (bVar8) {
        *puStack_40 = 0;
        uVar3 = uVar6;
      }
      UNLOCK();
      if (uVar3 == 3) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
        PVar5 = 0xffffffff;
        bVar7 = true;
        goto LAB_0033a2cc;
      }
      if (uVar3 != 0) {
        bVar7 = false;
        PVar5 = 0;
        if (!bVar8) {
          fprintf(_stderr,"] %s %s:%d","BlockThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0x164);
          fprintf(_stderr,
                  "Expression: dwOldWaitState == dwWaitState, Description: Unexpected wait status: actual=%u, expected=%u\n"
                  ,(ulong)uVar3);
          bVar7 = false;
          PVar5 = 0;
        }
        goto LAB_0033a2cc;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
      PVar5 = ThreadNativeWait(ptnwdNativeWaitData,0xffffffff,&local_34,&local_44);
      if (PVar5 != 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
        TVar4 = WaitFailed;
        goto LAB_0033a0fb;
      }
      bVar7 = false;
      PVar5 = 0;
      if (local_34 != WaitTimeout) goto LAB_0033a2cc;
      PVar5 = 0;
      bVar7 = false;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
LAB_0033a2dc:
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_0033a3d5;
      AcquireLocalSynchLock(pthrCurrent);
      UnRegisterWait(this,pthrCurrent,&(pthrCurrent->synchronizationInfo).m_twiWaitInfo,false);
      ReleaseLocalSynchLock(pthrCurrent);
      TVar4 = WaitTimeout;
    }
    else {
LAB_0033a2cc:
      TVar4 = local_34;
      if ((local_34 == WaitSucceeded) || (local_34 == MutexAbondoned)) {
        *pdwSignaledObject = local_44;
      }
      else if (local_34 == WaitTimeout) goto LAB_0033a2dc;
    }
LAB_0033a32b:
    puVar1 = puStack_40;
    *ptwrWakeupReason = TVar4;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033a3d5;
    if ((*puStack_40 != 0) && (*puStack_40 != 3)) {
      fprintf(_stderr,"] %s %s:%d","BlockThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x193);
      fprintf(_stderr,
              "Expression: TWS_ACTIVE == VolatileLoad(pdwWaitState) || TWS_EARLYDEATH == VolatileLoad(pdwWaitState), Description: Unexpected thread wait state %u\n"
              ,(ulong)*puVar1);
    }
    if (!bVar7) {
      return PVar5;
    }
  }
  ThreadPrepareForShutdown();
LAB_0033a3d5:
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::BlockThread(
        CPalThread *pthrCurrent,
        DWORD dwTimeout,
        bool fAlertable,
        bool fIsSleep,
        ThreadWakeupReason *ptwrWakeupReason,
        DWORD * pdwSignaledObject)
    {
        PAL_ERROR palErr = NO_ERROR;
        ThreadWakeupReason twrWakeupReason = WaitFailed;
        DWORD * pdwWaitState;
        DWORD dwWaitState = 0;
        DWORD dwSigObjIdx = 0;
        bool fRaceAlerted = false;
        bool fEarlyDeath = false;

        pdwWaitState = SharedIDToTypePointer(DWORD,
                pthrCurrent->synchronizationInfo.m_shridWaitAwakened);

        _ASSERT_MSG(NULL != pdwWaitState,
                    "Got NULL pdwWaitState from m_shridWaitAwakened=%p\n",
                    (VOID *)pthrCurrent->synchronizationInfo.m_shridWaitAwakened);

        if (fIsSleep)
        {
            // If fIsSleep is true we are being called by Sleep/SleepEx
            // and we need to switch the wait state to TWS_WAITING or
            // TWS_ALERTABLE (according to fAlertable)

            if (fAlertable)
            {
                // If we are in alertable mode we need to grab the lock to
                // make sure that no APC is queued right before the
                // InterlockedCompareExchange.
                // If there are APCs queued at this time, no native wakeup
                // will be posted, so we need to skip the native wait

                // Lock
                AcquireLocalSynchLock(pthrCurrent);
                AcquireSharedSynchLock(pthrCurrent);

                if (AreAPCsPending(pthrCurrent))
                {
                    // APCs have been queued when the thread wait status was
                    // still TWS_ACTIVE, therefore the queueing thread will not
                    // post any native wakeup: we need to skip the actual
                    // native wait
                    fRaceAlerted = true;
                }
            }

            if (!fRaceAlerted)
            {
                // Setting the thread in wait state
                dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE : TWS_WAITING);

                TRACE("Switching my wait state [%p] from TWS_ACTIVE to %u "
                      "[current *pdwWaitState=%u]\n",
                      pdwWaitState, dwWaitState, *pdwWaitState);

                dwWaitState = InterlockedCompareExchange((LONG *)pdwWaitState,
                                                         dwWaitState,
                                                         TWS_ACTIVE);

                if((DWORD)TWS_ACTIVE != dwWaitState)
                {
                    if (fAlertable)
                    {
                        // Unlock
                        ReleaseSharedSynchLock(pthrCurrent);
                        ReleaseLocalSynchLock(pthrCurrent);
                    }
                    if((DWORD)TWS_EARLYDEATH == dwWaitState)
                    {
                        // Process is terminating, this thread will soon be
                        // suspended (by SuspendOtherThreads).
                        WARN("Thread is about to get suspended by "
                             "TerminateProcess\n");

                        fEarlyDeath = true;
                        palErr = WAIT_FAILED;
                    }
                    else
                    {
                        ASSERT("Unexpected thread wait state %u\n",
                               dwWaitState);
                        palErr = ERROR_INTERNAL_ERROR;
                    }
                    goto BT_exit;
                }
            }

            if (fAlertable)
            {
                // Unlock
                ReleaseSharedSynchLock(pthrCurrent);
                ReleaseLocalSynchLock(pthrCurrent);
            }
        }

        if (fRaceAlerted)
        {
            twrWakeupReason = Alerted;
        }
        else
        {
            TRACE("Current thread is about to block for waiting\n");

            palErr = ThreadNativeWait(
                &pthrCurrent->synchronizationInfo.m_tnwdNativeData,
                dwTimeout,
                &twrWakeupReason,
                &dwSigObjIdx);

            if (NO_ERROR != palErr)
            {
                ERROR("ThreadNativeWait() failed [palErr=%d]\n", palErr);
                twrWakeupReason = WaitFailed;
                goto BT_exit;
            }

            TRACE("ThreadNativeWait returned {WakeupReason=%u "
                  "dwSigObjIdx=%u}\n", twrWakeupReason, dwSigObjIdx);
        }

        if (WaitTimeout == twrWakeupReason)
        {
            // timeout reached. set wait state back to 'active'
            dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE : TWS_WAITING);

            TRACE("Current thread awakened for timeout: switching wait "
                  "state [%p] from %u to TWS_ACTIVE [current *pdwWaitState=%u]\n",
                   pdwWaitState, dwWaitState, *pdwWaitState);

            DWORD dwOldWaitState = InterlockedCompareExchange(
                                        (LONG *)pdwWaitState,
                                        TWS_ACTIVE, (LONG)dwWaitState);

            switch (dwOldWaitState)
            {
                case TWS_ACTIVE:
                    // We were already ACTIVE; someone decided to wake up this
                    // thread sometime between the moment the native wait
                    // timed out and here. Since the signaling side succeeded
                    // its InterlockedCompareExchange, it will signal the
                    // condition/predicate pair (we just raced overtaking it);
                    // therefore we need to clear the condition/predicate
                    // by waiting on it one more time.
                    // That will also cause this method to report a signal
                    // rather than a timeout.
                    // In the remote signaling scenario, this second wait
                    // also makes sure that the shared id passed over the
                    // process pipe is valid for the entire duration of time
                    // in which the worker thread deals with it
                    TRACE("Current thread already ACTIVE: a signaling raced "
                          "with the timeout: re-waiting natively to clear the "
                          "predicate\n");

                    palErr = ThreadNativeWait(
                        &pthrCurrent->synchronizationInfo.m_tnwdNativeData,
                        SecondNativeWaitTimeout,
                        &twrWakeupReason,
                        &dwSigObjIdx);

                    if (NO_ERROR != palErr)
                    {
                        ERROR("ThreadNativeWait() failed [palErr=%d]\n",
                              palErr);
                        twrWakeupReason = WaitFailed;
                    }
                    if (WaitTimeout == twrWakeupReason)
                    {
                        ERROR("Second native wait timed out\n");
                    }
                    break;
                case TWS_EARLYDEATH:
                    // Thread is about to be suspended by TerminateProcess.
                    // Anyway, if the wait timed out, we still want to
                    // (try to) unregister the wait (especially if it
                    // involves shared objects)
                    WARN("Thread is about to be suspended by "
                         "TerminateProcess\n");
                    fEarlyDeath = true;
                    palErr = WAIT_FAILED;
                    break;
                case TWS_WAITING:
                case TWS_ALERTABLE:
                default:
                    _ASSERT_MSG(dwOldWaitState == dwWaitState,
                                "Unexpected wait status: actual=%u, "
                                "expected=%u\n",
                               dwOldWaitState, dwWaitState);
                    break;
            }
        }

        switch (twrWakeupReason)
        {
            case WaitTimeout:
            {
                // Awakened for timeout: we need to unregister the wait
                ThreadWaitInfo * ptwiWaitInfo;

                TRACE("Current thread awakened for timeout: "
                            "unregistering the wait\n");

                // Local lock
                AcquireLocalSynchLock(pthrCurrent);

                ptwiWaitInfo = GetThreadWaitInfo(pthrCurrent);

                // Unregister the wait
                // Note: UnRegisterWait will take care of grabbing the shared
                //       synch lock, if needed.
                UnRegisterWait(pthrCurrent, ptwiWaitInfo, false);

                // Unlock
                ReleaseLocalSynchLock(pthrCurrent);

                break;
            }
            case WaitSucceeded:
            case MutexAbondoned:
                *pdwSignaledObject = dwSigObjIdx;
                break;
            default:
                // 'Alerted' and 'WaitFailed' go through this case
                break;
        }

        // Set the returned wakeup reason
        *ptwrWakeupReason = twrWakeupReason;

        TRACE("Current thread is now active [WakeupReason=%u SigObjIdx=%u]\n",
              twrWakeupReason, dwSigObjIdx);

        _ASSERT_MSG(TWS_ACTIVE == VolatileLoad(pdwWaitState) ||
                    TWS_EARLYDEATH == VolatileLoad(pdwWaitState),
                    "Unexpected thread wait state %u\n", VolatileLoad(pdwWaitState));

    BT_exit:
        if (fEarlyDeath)
        {
            ThreadPrepareForShutdown();
        }
        return palErr;
    }